

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperOpFailure<unsigned_long,unsigned_long>
          (char *expr1,char *expr2,unsigned_long *val1,unsigned_long *val2,char *op)

{
  AssertionResult *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  AssertionResult *value_00;
  AssertionResult *pAVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult *in_RDI;
  AssertionResult AVar3;
  unsigned_long *in_stack_ffffffffffffff10;
  unsigned_long *in_stack_ffffffffffffff18;
  char (*in_stack_ffffffffffffff38) [12];
  AssertionResult *in_stack_ffffffffffffff40;
  string local_90 [32];
  string local_70 [112];
  
  AssertionFailure();
  AssertionResult::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  AssertionResult::operator<<(in_stack_ffffffffffffff40,(char **)in_stack_ffffffffffffff38);
  pAVar1 = AssertionResult::operator<<
                     (in_stack_ffffffffffffff40,(char (*) [3])in_stack_ffffffffffffff38);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          AssertionResult::operator<<(pAVar1,(char **)in_stack_ffffffffffffff38);
  AssertionResult::operator<<(pAVar1,(char (*) [3])value);
  AssertionResult::operator<<(pAVar1,(char **)value);
  AssertionResult::operator<<(pAVar1,(char (*) [12])value);
  FormatForComparisonFailureMessage<unsigned_long,unsigned_long>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  value_00 = AssertionResult::operator<<(pAVar1,value);
  pAVar2 = AssertionResult::operator<<(pAVar1,(char (*) [5])value);
  FormatForComparisonFailureMessage<unsigned_long,unsigned_long>
            ((unsigned_long *)value_00,(unsigned_long *)pAVar2);
  pAVar1 = AssertionResult::operator<<(pAVar1,value);
  AssertionResult::AssertionResult(in_RDI,pAVar1);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  AssertionResult::~AssertionResult((AssertionResult *)0x10eb36);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}